

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O2

rtr_secure_path_seg * rtr_bgpsec_pop_secure_path_seg(rtr_bgpsec *bgpsec)

{
  long lVar1;
  rtr_secure_path_seg *prVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prVar2 = bgpsec->path;
  if (prVar2 != (rtr_secure_path_seg *)0x0) {
    bgpsec->path = prVar2->next;
    bgpsec->path_len = bgpsec->path_len + 0xff;
    prVar2->next = (rtr_secure_path_seg *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return prVar2;
  }
  __stack_chk_fail();
}

Assistant:

struct rtr_secure_path_seg *rtr_bgpsec_pop_secure_path_seg(struct rtr_bgpsec *bgpsec)
{
	struct rtr_secure_path_seg *tmp = NULL;

	if (!bgpsec->path)
		return NULL;

	tmp = bgpsec->path;
	bgpsec->path = bgpsec->path->next;
	bgpsec->path_len--;
	tmp->next = NULL;
	return tmp;
}